

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SstReader.cpp
# Opt level: O2

void __thiscall adios2::core::engine::SstReader::DestructorClose(SstReader *this,bool Verbose)

{
  ostream *poVar1;
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,Verbose) != 0) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"SST Reader \"");
    poVar1 = std::operator<<(poVar1,(string *)&(this->super_Engine).m_Name);
    poVar1 = std::operator<<(poVar1,"\" Destroyed without a prior Close().");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cerr,
                             "This may result in \"unexpected close\" or \"failed to send\" warning from a connected SST Writer."
                            );
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  (this->super_Engine).m_IsOpen = false;
  return;
}

Assistant:

void SstReader::DestructorClose(bool Verbose) noexcept
{
    if (Verbose)
    {
        std::cerr << "SST Reader \"" << m_Name << "\" Destroyed without a prior Close()."
                  << std::endl;
        std::cerr << "This may result in \"unexpected close\" or \"failed to "
                     "send\" warning from a connected SST Writer."
                  << std::endl;
    }
    m_IsOpen = false;
}